

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O2

CharMapper<unsigned_char> * gmlc::utilities::base64Mapper(void)

{
  long lVar1;
  CharMapper<unsigned_char> *in_RDI;
  
  memset(in_RDI,0xff,0x100);
  for (lVar1 = 0; (uchar)lVar1 != '\x1a'; lVar1 = lVar1 + 1) {
    (in_RDI->key)._M_elems[lVar1 + 0x41] = (uchar)lVar1;
  }
  for (lVar1 = -0x1a; lVar1 != 0; lVar1 = lVar1 + 1) {
    (in_RDI->key)._M_elems[lVar1 + 0x7b] = (char)lVar1 + '4';
  }
  for (lVar1 = -10; lVar1 != 0; lVar1 = lVar1 + 1) {
    (in_RDI->key)._M_elems[lVar1 + 0x3a] = (char)lVar1 + '>';
  }
  (in_RDI->key)._M_elems[0x2b] = '>';
  (in_RDI->key)._M_elems[0x2f] = '?';
  return in_RDI;
}

Assistant:

CharMapper<unsigned char> base64Mapper()
{
    CharMapper<unsigned char> b64(0xFF);
    unsigned char val{0};
    for (unsigned char indexChar = 'A'; indexChar <= 'Z'; ++indexChar) {
        b64.addKey(indexChar, val);
        ++val;
    }
    for (unsigned char indexChar = 'a'; indexChar <= 'z'; ++indexChar) {
        b64.addKey(indexChar, val);
        ++val;
    }
    for (unsigned char indexChar = '0'; indexChar <= '9'; ++indexChar) {
        b64.addKey(indexChar, val);
        ++val;
    }
    b64.addKey('+', val++);
    b64.addKey('/', val);
    return b64;
}